

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdjacencyTree.hpp
# Opt level: O0

AdjSplayVertex * __thiscall
konig::AdjacencyTree::_lower_bound(AdjacencyTree *this,adjacency_t adjacency)

{
  bool bVar1;
  AdjSplayVertex *local_28;
  AdjSplayVertex *cut_point;
  AdjSplayVertex *vertex;
  AdjacencyTree *this_local;
  adjacency_t adjacency_local;
  
  this_local = (AdjacencyTree *)adjacency;
  cut_point = root(this);
  local_28 = (AdjSplayVertex *)0x0;
  while (cut_point != (AdjSplayVertex *)0x0) {
    bVar1 = std::operator>=(&cut_point->adjacency,(pair<unsigned_int,_unsigned_int> *)&this_local);
    if (bVar1) {
      local_28 = cut_point;
      bVar1 = std::operator==(&cut_point->adjacency,(pair<unsigned_int,_unsigned_int> *)&this_local)
      ;
      if (bVar1) break;
      cut_point = cut_point->left_child;
    }
    else {
      cut_point = cut_point->right_child;
    }
  }
  if (local_28 != (AdjSplayVertex *)0x0) {
    splay(this,local_28);
  }
  return local_28;
}

Assistant:

AdjSplayVertex* _lower_bound(adjacency_t adjacency) noexcept {
            AdjSplayVertex* vertex = root();
            AdjSplayVertex* cut_point = NULL;

            while (vertex) {
                if (vertex->adjacency >= adjacency) {
                    cut_point = vertex;

                    if (vertex->adjacency == adjacency) // There are no duplicates in this structure
                        break;
                    else
                        vertex = vertex->left_child;
                } else {
                    vertex = vertex->right_child;
                }
            }

            if (cut_point)
                splay(cut_point);
            return cut_point;
        }